

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_NtkMarkCone(Wlc_Ntk_t *p,int iCoId,int Range,int fSeq,int fAllPis)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  Vec_Int_t *vFlops;
  int *piVar4;
  
  Wlc_NtkCleanMarks(p);
  if ((fAllPis != 0) && (0 < (p->vPis).nSize)) {
    lVar3 = 0;
    do {
      iVar1 = (p->vPis).pArray[lVar3];
      if (((long)iVar1 < 1) || (p->nObjsAlloc <= iVar1)) goto LAB_0036a51e;
      *(ushort *)(p->pObjs + iVar1) = *(ushort *)(p->pObjs + iVar1) | 0x80;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (p->vPis).nSize);
  }
  vFlops = (Vec_Int_t *)malloc(0x10);
  vFlops->nCap = 100;
  vFlops->nSize = 0;
  piVar4 = (int *)malloc(400);
  vFlops->pArray = piVar4;
  if (0 < (p->vCos).nSize) {
    lVar3 = 0;
    do {
      iVar1 = (p->vCos).pArray[lVar3];
      if (((long)iVar1 < 1) || (p->nObjsAlloc <= iVar1)) goto LAB_0036a51e;
      if ((iCoId == -1) || ((iCoId <= lVar3 && (lVar3 < Range + iCoId)))) {
        Wlc_NtkMarkCone_rec(p,p->pObjs + iVar1,vFlops);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (p->vCos).nSize);
  }
  if ((fSeq != 0) && (0 < vFlops->nSize)) {
    lVar3 = 0;
    do {
      uVar2 = ((p->vPos).nSize + vFlops->pArray[lVar3]) - (p->vPis).nSize;
      if (((int)uVar2 < 0) || ((p->vCos).nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = (p->vCos).pArray[uVar2];
      if (((long)iVar1 < 1) || (p->nObjsAlloc <= iVar1)) {
LAB_0036a51e:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      Wlc_NtkMarkCone_rec(p,p->pObjs + iVar1,vFlops);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vFlops->nSize);
  }
  if (vFlops->pArray != (int *)0x0) {
    free(vFlops->pArray);
    vFlops->pArray = (int *)0x0;
  }
  free(vFlops);
  return;
}

Assistant:

void Wlc_NtkMarkCone( Wlc_Ntk_t * p, int iCoId, int Range, int fSeq, int fAllPis )
{
    Vec_Int_t * vFlops;
    Wlc_Obj_t * pObj;
    int i, CiId, CoId;
    Wlc_NtkCleanMarks( p );
    if ( fAllPis )
    Wlc_NtkForEachPi( p, pObj, i )
        pObj->Mark = 1;
    vFlops = Vec_IntAlloc( 100 );
    Wlc_NtkForEachCo( p, pObj, i )
        if ( iCoId == -1 || (i >= iCoId && i < iCoId + Range) )
            Wlc_NtkMarkCone_rec( p, pObj, vFlops );
    if ( fSeq )
    Vec_IntForEachEntry( vFlops, CiId, i )
    {
        CoId = Wlc_NtkPoNum(p) + CiId - Wlc_NtkPiNum(p);
        Wlc_NtkMarkCone_rec( p, Wlc_NtkCo(p, CoId), vFlops );
    }
    Vec_IntFree( vFlops );
}